

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingTest::init(VaryingTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  VertexVaryingShader *this_00;
  RenderContext *pRVar2;
  EVP_PKEY_CTX *ctx_00;
  int local_14;
  VaryingTest *local_10;
  VaryingTest *this_local;
  
  local_10 = this;
  this_00 = (VertexVaryingShader *)operator_new(0x160);
  pRVar2 = gles31::Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_14 = (*pRVar2->_vptr_RenderContext[2])();
  ctx_00 = (EVP_PKEY_CTX *)&local_14;
  VertexVaryingShader::VertexVaryingShader
            (this_00,(ContextType *)ctx_00,this->m_vertexOut,this->m_geometryOut);
  this->m_program = this_00;
  iVar1 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar1;
}

Assistant:

void VaryingTest::init (void)
{
	m_program = new VertexVaryingShader(m_context.getRenderContext().getType(), m_vertexOut, m_geometryOut);

	GeometryShaderRenderTest::init();
}